

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000170610 = 0x2e2e2e2e2e2e2e;
    uRam0000000000170617 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00170600 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000170608 = 0x2e2e2e2e2e2e2e;
    DAT_0017060f = 0x2e;
    _DAT_001705f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001705f8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001705e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001705e8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001705d8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017061f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }